

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<TPZEqnArray<float>_> * __thiscall
TPZVec<TPZEqnArray<float>_>::operator=
          (TPZVec<TPZEqnArray<float>_> *this,TPZVec<TPZEqnArray<float>_> *copy)

{
  int64_t iVar1;
  TPZEqnArray<float> *in_RSI;
  TPZEqnArray<float> *in_RDI;
  int64_t i;
  TPZEqnArray<float> *in_stack_ffffffffffffffd8;
  long local_18;
  
  if (in_RDI != in_RSI) {
    iVar1 = NElements((TPZVec<TPZEqnArray<float>_> *)in_RSI);
    (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,iVar1);
    for (local_18 = 0;
        local_18 < (long)(in_RSI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
        local_18 = local_18 + 1) {
      TPZEqnArray<float>::operator=(in_RDI,in_stack_ffffffffffffffd8);
    }
  }
  return (TPZVec<TPZEqnArray<float>_> *)in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}